

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

void VP8LHistogramCreate(VP8LHistogram *p,VP8LBackwardRefs *refs,int palette_code_bits)

{
  uint32_t *puVar1;
  int iVar2;
  
  if (palette_code_bits < 0) {
    palette_code_bits = p->palette_code_bits_;
  }
  puVar1 = p->literal_;
  iVar2 = (4 << ((byte)palette_code_bits & 0x1f)) + 0x1138;
  if (palette_code_bits < 1) {
    iVar2 = 0x1138;
  }
  memset(p,0,(long)iVar2);
  p->palette_code_bits_ = palette_code_bits;
  p->literal_ = puVar1;
  VP8LHistogramStoreRefs(refs,p);
  return;
}

Assistant:

void VP8LHistogramCreate(VP8LHistogram* const p,
                         const VP8LBackwardRefs* const refs,
                         int palette_code_bits) {
  if (palette_code_bits >= 0) {
    p->palette_code_bits_ = palette_code_bits;
  }
  HistogramClear(p);
  VP8LHistogramStoreRefs(refs, p);
}